

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncode.c
# Opt level: O3

int testEncode(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  cmsysMD5 *md5;
  uchar digest [16];
  uchar auStack_68 [16];
  char local_58 [32];
  undefined1 local_38;
  
  md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5,
                  "  A quick brown fox jumps over the lazy dog.\n  This is sample text for MD5 sum input.\n"
                  ,-1);
  cmsysMD5_FinalizeHex(md5,local_58);
  local_38 = 0;
  printf("md5sum 1: expected [%s]\n               got [%s]\n","8f146af46ed4f267921bb937d4d3500c",
         local_58);
  iVar1 = bcmp(local_58,"8f146af46ed4f267921bb937d4d3500c",0x21);
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5,"the cow jumped over the moon",0x1c);
  cmsysMD5_Finalize(md5,auStack_68);
  cmsysMD5_DigestToHex(auStack_68,local_58);
  local_38 = 0;
  printf("md5sum 2: expected [%s]\n               got [%s]\n","a2ad137b746138fae4e5adca9c85d3ae",
         local_58);
  iVar2 = bcmp(local_58,"a2ad137b746138fae4e5adca9c85d3ae",0x21);
  cmsysMD5_Delete(md5);
  return (int)(iVar2 != 0 || iVar1 != 0);
}

Assistant:

int testEncode(int argc, char* argv[])
{
  int result = 0;
  (void)argc;
  (void)argv;

  /* Test MD5 digest.  */
  {
    kwsysMD5* md5 = kwsysMD5_New();
    result |= testMD5_1(md5);
    result |= testMD5_2(md5);
    kwsysMD5_Delete(md5);
  }

  return result;
}